

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_unit.c
# Opt level: O3

void setandextract_uint32(void)

{
  ulong length;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  uint16_t *list;
  uint64_t *words;
  uint32_t *out;
  short sVar6;
  long lVar7;
  short sVar8;
  short sVar9;
  ulong uVar10;
  short sVar11;
  short sVar12;
  uint16_t uVar13;
  short sVar14;
  int iVar16;
  undefined1 auVar15 [16];
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  int iVar37;
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  undefined1 auVar39 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar44 [16];
  long lVar19;
  
  uVar10 = 1;
  sVar14 = 7;
  sVar9 = 8;
  sVar5 = 6;
  sVar6 = 5;
  sVar8 = 4;
  sVar11 = 3;
  sVar12 = 2;
  do {
    uVar13 = 0;
    length = 0x10000 / (uVar10 & 0xffffffff);
    list = (uint16_t *)malloc((ulong)(uint)((int)length * 2));
    words = (uint64_t *)calloc(0x400,8);
    auVar2 = _DAT_00107070;
    lVar7 = length - 1;
    auVar15._8_4_ = (int)lVar7;
    auVar15._0_8_ = lVar7;
    auVar15._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar10;
    lVar7 = 7;
    auVar15 = auVar15 ^ _DAT_00107070;
    auVar18 = _DAT_00107060;
    auVar20 = _DAT_00107050;
    auVar21 = _DAT_00107040;
    auVar22 = _DAT_00107030;
    do {
      auVar23 = auVar18 ^ auVar2;
      iVar37 = auVar15._0_4_;
      iVar36 = -(uint)(iVar37 < auVar23._0_4_);
      iVar16 = auVar15._4_4_;
      auVar24._4_4_ = -(uint)(iVar16 < auVar23._4_4_);
      iVar41 = auVar15._8_4_;
      iVar40 = -(uint)(iVar41 < auVar23._8_4_);
      iVar17 = auVar15._12_4_;
      auVar24._12_4_ = -(uint)(iVar17 < auVar23._12_4_);
      auVar33._4_4_ = iVar36;
      auVar33._0_4_ = iVar36;
      auVar33._8_4_ = iVar40;
      auVar33._12_4_ = iVar40;
      auVar42 = pshuflw(in_XMM8,auVar33,0xe8);
      auVar26._4_4_ = -(uint)(auVar23._4_4_ == iVar16);
      auVar26._12_4_ = -(uint)(auVar23._12_4_ == iVar17);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar44 = pshuflw(in_XMM9,auVar26,0xe8);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar43 = pshuflw(auVar42,auVar24,0xe8);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar43 | auVar44 & auVar42) ^ auVar23;
      auVar23 = packssdw(auVar23,auVar23);
      if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        list[lVar7 + -7] = uVar13;
      }
      auVar24 = auVar26 & auVar33 | auVar24;
      auVar23 = packssdw(auVar24,auVar24);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar43,auVar23 ^ auVar43);
      if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
        list[lVar7 + -6] = (short)uVar10 + uVar13;
      }
      auVar23 = auVar20 ^ auVar2;
      iVar36 = -(uint)(iVar37 < auVar23._0_4_);
      auVar38._4_4_ = -(uint)(iVar16 < auVar23._4_4_);
      iVar40 = -(uint)(iVar41 < auVar23._8_4_);
      auVar38._12_4_ = -(uint)(iVar17 < auVar23._12_4_);
      auVar25._4_4_ = iVar36;
      auVar25._0_4_ = iVar36;
      auVar25._8_4_ = iVar40;
      auVar25._12_4_ = iVar40;
      auVar32._4_4_ = -(uint)(auVar23._4_4_ == iVar16);
      auVar32._12_4_ = -(uint)(auVar23._12_4_ == iVar17);
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar38._0_4_ = auVar38._4_4_;
      auVar38._8_4_ = auVar38._12_4_;
      auVar23 = auVar32 & auVar25 | auVar38;
      auVar23 = packssdw(auVar23,auVar23);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar3,auVar23 ^ auVar3);
      if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        list[lVar7 + -5] = sVar12 + uVar13;
      }
      auVar26 = pshufhw(auVar25,auVar25,0x84);
      auVar33 = pshufhw(auVar32,auVar32,0x84);
      auVar24 = pshufhw(auVar26,auVar38,0x84);
      auVar27._8_4_ = 0xffffffff;
      auVar27._0_8_ = 0xffffffffffffffff;
      auVar27._12_4_ = 0xffffffff;
      auVar27 = (auVar24 | auVar33 & auVar26) ^ auVar27;
      auVar26 = packssdw(auVar27,auVar27);
      if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        list[lVar7 + -4] = sVar11 + uVar13;
      }
      auVar26 = auVar21 ^ auVar2;
      iVar36 = -(uint)(iVar37 < auVar26._0_4_);
      auVar29._4_4_ = -(uint)(iVar16 < auVar26._4_4_);
      iVar40 = -(uint)(iVar41 < auVar26._8_4_);
      auVar29._12_4_ = -(uint)(iVar17 < auVar26._12_4_);
      auVar34._4_4_ = iVar36;
      auVar34._0_4_ = iVar36;
      auVar34._8_4_ = iVar40;
      auVar34._12_4_ = iVar40;
      auVar23 = pshuflw(auVar23,auVar34,0xe8);
      auVar28._4_4_ = -(uint)(auVar26._4_4_ == iVar16);
      auVar28._12_4_ = -(uint)(auVar26._12_4_ == iVar17);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      in_XMM9 = pshuflw(auVar44 & auVar42,auVar28,0xe8);
      in_XMM9 = in_XMM9 & auVar23;
      auVar29._0_4_ = auVar29._4_4_;
      auVar29._8_4_ = auVar29._12_4_;
      auVar23 = pshuflw(auVar23,auVar29,0xe8);
      auVar42._8_4_ = 0xffffffff;
      auVar42._0_8_ = 0xffffffffffffffff;
      auVar42._12_4_ = 0xffffffff;
      auVar42 = (auVar23 | in_XMM9) ^ auVar42;
      auVar23 = packssdw(auVar42,auVar42);
      if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        list[lVar7 + -3] = sVar8 + uVar13;
      }
      auVar29 = auVar28 & auVar34 | auVar29;
      auVar23 = packssdw(auVar29,auVar29);
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      auVar23 = packssdw(auVar23 ^ auVar44,auVar23 ^ auVar44);
      if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        list[lVar7 + -2] = sVar6 + uVar13;
      }
      auVar23 = auVar22 ^ auVar2;
      iVar37 = -(uint)(iVar37 < auVar23._0_4_);
      auVar39._4_4_ = -(uint)(iVar16 < auVar23._4_4_);
      iVar41 = -(uint)(iVar41 < auVar23._8_4_);
      auVar39._12_4_ = -(uint)(iVar17 < auVar23._12_4_);
      auVar30._4_4_ = iVar37;
      auVar30._0_4_ = iVar37;
      auVar30._8_4_ = iVar41;
      auVar30._12_4_ = iVar41;
      auVar35._4_4_ = -(uint)(auVar23._4_4_ == iVar16);
      auVar35._12_4_ = -(uint)(auVar23._12_4_ == iVar17);
      auVar35._0_4_ = auVar35._4_4_;
      auVar35._8_4_ = auVar35._12_4_;
      auVar39._0_4_ = auVar39._4_4_;
      auVar39._8_4_ = auVar39._12_4_;
      auVar23 = auVar35 & auVar30 | auVar39;
      auVar23 = packssdw(auVar23,auVar23);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      in_XMM8 = packssdw(auVar23 ^ auVar4,auVar23 ^ auVar4);
      if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        list[lVar7 + -1] = sVar5 + uVar13;
      }
      auVar23 = pshufhw(auVar30,auVar30,0x84);
      auVar24 = pshufhw(auVar35,auVar35,0x84);
      auVar26 = pshufhw(auVar23,auVar39,0x84);
      auVar31._8_4_ = 0xffffffff;
      auVar31._0_8_ = 0xffffffffffffffff;
      auVar31._12_4_ = 0xffffffff;
      auVar31 = (auVar26 | auVar24 & auVar23) ^ auVar31;
      auVar23 = packssdw(auVar31,auVar31);
      if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        list[lVar7] = sVar14 + uVar13;
      }
      lVar19 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 8;
      auVar18._8_8_ = lVar19 + 8;
      lVar19 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 8;
      auVar20._8_8_ = lVar19 + 8;
      lVar19 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 8;
      auVar21._8_8_ = lVar19 + 8;
      lVar19 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 8;
      auVar22._8_8_ = lVar19 + 8;
      uVar13 = uVar13 + sVar9;
      lVar19 = lVar7 - (ulong)(SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) / auVar1,0) + 7U &
                              0x3fff8);
      lVar7 = lVar7 + 8;
    } while (lVar19 != -1);
    bitset_set_list(words,list,length);
    out = (uint32_t *)malloc(length * 4);
    bitset_extract_setbits(words,0x400,out,0);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    lVar7 = 0;
    do {
      _assert_int_equal((ulong)out[lVar7],(ulong)list[lVar7],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/util_unit.c"
                        ,0x44);
      lVar7 = lVar7 + 1;
    } while (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) / auVar2,0) != lVar7);
    free(list);
    free(out);
    free(words);
    uVar10 = uVar10 + 1;
    sVar14 = sVar14 + 7;
    sVar9 = sVar9 + 8;
    sVar5 = sVar5 + 6;
    sVar6 = sVar6 + 5;
    sVar8 = sVar8 + 4;
    sVar11 = sVar11 + 3;
    sVar12 = sVar12 + 2;
  } while (uVar10 != 0x10000);
  return;
}

Assistant:

DEFINE_TEST(setandextract_uint32) {
    const unsigned int bitset_size = 1 << 16;
    const unsigned int bitset_size_in_words =
        bitset_size / (sizeof(uint64_t) * 8);

    for (unsigned int offset = 1; offset < bitset_size; offset++) {
        const unsigned int valsize = bitset_size / offset;
        uint16_t* vals = (uint16_t*)malloc(valsize * sizeof(uint16_t));
        uint64_t* bitset =
            (uint64_t*)calloc(bitset_size_in_words, sizeof(uint64_t));

        for (unsigned int k = 0; k < valsize; ++k) {
            vals[k] = (uint16_t)(k * offset);
        }

        bitset_set_list(bitset, vals, valsize);
        uint32_t* newvals = (uint32_t*)malloc(valsize * sizeof(uint32_t));
        bitset_extract_setbits(bitset, bitset_size_in_words, newvals, 0);

        for (unsigned int k = 0; k < valsize; ++k) {
            assert_int_equal(newvals[k], vals[k]);
        }

        free(vals);
        free(newvals);
        free(bitset);
    }
}